

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O2

appender __thiscall
fmt::v9::detail::printf_arg_formatter<fmt::v9::appender,_char>::write_null_pointer
          (printf_arg_formatter<fmt::v9::appender,_char> *this,bool is_string)

{
  basic_format_specs<char> *pbVar1;
  char *out;
  appender aVar2;
  undefined7 in_register_00000031;
  basic_format_specs<char> *in_R8;
  string_view bytes;
  basic_format_specs<char> s;
  undefined8 local_18;
  ulong uStack_10;
  
  pbVar1 = (this->super_arg_formatter<char>).specs;
  local_18._0_4_ = pbVar1->width;
  local_18._4_4_ = pbVar1->precision;
  uStack_10._0_1_ = pbVar1->type;
  uStack_10._1_2_ = *(undefined2 *)&pbVar1->field_0x9;
  uStack_10._3_1_ = (pbVar1->fill).data_[0];
  uStack_10._4_1_ = (pbVar1->fill).data_[1];
  uStack_10._5_1_ = (pbVar1->fill).data_[2];
  uStack_10._6_1_ = (pbVar1->fill).data_[3];
  uStack_10._7_1_ = (pbVar1->fill).size_;
  uStack_10 = uStack_10 & 0xffffffffffffff00;
  out = "(nil)";
  if ((int)CONCAT71(in_register_00000031,is_string) != 0) {
    out = "(null)";
  }
  bytes.data_ = (char *)((CONCAT71(in_register_00000031,is_string) & 0xffffffff) + 5);
  bytes.size_ = (size_t)&local_18;
  aVar2 = write_bytes<(fmt::v9::align::type)1,char,fmt::v9::appender>
                    ((detail *)
                     (this->super_arg_formatter<char>).out.
                     super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,
                     (appender)out,bytes,in_R8);
  return (appender)aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
}

Assistant:

OutputIt write_null_pointer(bool is_string = false) {
    auto s = this->specs;
    s.type = presentation_type::none;
    return write_bytes(this->out, is_string ? "(null)" : "(nil)", s);
  }